

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O0

void __thiscall
signalInfo_t::addData(signalInfo_t *this,uint64_t ntpTimestamp,double *pValues,size_t count)

{
  void *pvVar1;
  ostream *poVar2;
  ulong in_RCX;
  double *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  size_t i;
  ulong local_28;
  double *local_18;
  
  pvVar1 = (void *)std::ostream::operator<<(in_RDI,std::hex);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar1,std::dec);
  std::operator<<(poVar2," ");
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(in_RDI,*local_18);
    std::operator<<(poVar2," ");
    local_18 = local_18 + 1;
  }
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  *(long *)((long)in_RDI + 0x200) = *(long *)((long)in_RDI + 0x200) + 1;
  return;
}

Assistant:

void addData(uint64_t ntpTimestamp, const double* pValues, size_t count)
	{
		dataFile << std::hex << ntpTimestamp << std::dec << " ";
		for (size_t i=0; i<count; ++i) {
			dataFile << *pValues << " ";
			++pValues;
		}
		dataFile << std::endl;
		++dataFileNextLine;
	}